

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O0

ConstantValue * __thiscall slang::CVIterator::operator*(CVIterator *this)

{
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Kuree[P]hgdb_rtl_extern_slang_source_numeric_ConstantValue_cpp:620:9),_std::variant<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>_&>
  pCVar1;
  anon_class_1_0_00000001 local_11;
  CVIterator *local_10;
  CVIterator *this_local;
  
  local_10 = this;
  pCVar1 = std::operator*(&local_11,&this->current);
  return pCVar1;
}

Assistant:

ConstantValue& CVIterator::operator*() {
    return std::visit(
        [](auto&& arg) -> ConstantValue& {
            using T = std::decay_t<decltype(arg)>;
            if constexpr (std::is_same_v<T, AssociativeArray::iterator>)
                return arg->second;
            else
                return *arg;
        },
        current);
}